

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGhsMultiGenerator::GenerateTargetsDepthFirst
          (cmLocalGhsMultiGenerator *this,cmGeneratorTarget *target,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *remaining)

{
  TargetType TVar1;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  _Var2;
  cmGhsMultiTargetGenerator tg;
  cmGeneratorTarget *local_100;
  cmGhsMultiTargetGenerator local_f8;
  
  local_100 = target;
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 != INTERFACE_LIBRARY) {
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmGeneratorTarget*const>>
                      ((remaining->
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (remaining->
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&local_100);
    if (_Var2._M_current !=
        (remaining->super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      *_Var2._M_current = (cmGeneratorTarget *)0x0;
      cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator(&local_f8,local_100);
      cmGhsMultiTargetGenerator::Generate(&local_f8);
      cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator(&local_f8);
    }
  }
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::GenerateTargetsDepthFirst(
  cmGeneratorTarget* target, std::vector<cmGeneratorTarget*>& remaining)
{
  if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return;
  }
  // Find this target in the list of remaining targets.
  auto it = std::find(remaining.begin(), remaining.end(), target);
  if (it == remaining.end()) {
    // This target was already handled.
    return;
  }
  // Remove this target from the list of remaining targets because
  // we are handling it now.
  *it = nullptr;

  cmGhsMultiTargetGenerator tg(target);
  tg.Generate();
}